

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O2

bool TestAnalogInputs(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  ostream *poVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double local_108;
  double measured;
  double potV [4];
  double local_c0;
  double local_b8;
  double local_b0;
  unsigned_long pot [4];
  char buf [80];
  
  local_108 = (double)CONCAT44(local_108._4_4_,qlaNum);
  poVar4 = std::endl<char,std::char_traits<char>>((ostream *)logFile);
  poVar4 = std::operator<<(poVar4,"=== Analog Inputs ===");
  std::endl<char,std::char_traits<char>>(poVar4);
  Amp1394Console::Print
            (curLine,9,"This test uses the pot on the test board to set a voltage (+/-0.25V)");
  do {
    Amp1394Console::Print(curLine + 1,9,"Enter pot voltage: ");
    Amp1394Console::GetString(buf,0x50);
    iVar1 = __isoc99_sscanf(buf,"%lf",&measured);
  } while (iVar1 != 1);
  std::operator<<((ostream *)logFile,"   Input voltage: ");
  poVar4 = std::ostream::_M_insert<double>(measured);
  std::endl<char,std::char_traits<char>>(poVar4);
  pot[2] = 0;
  pot[3] = 0;
  pot[0] = 0;
  pot[1] = 0;
  uVar7 = 0;
  for (iVar1 = 0; iVar1 != 0x10; iVar1 = iVar1 + 1) {
    iVar2 = (*Port->_vptr_BasePort[0x1d])(Port);
    if ((char)iVar2 != '\0') {
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        uVar3 = AmpIO::GetAnalogInput(Board,(uint)(qlaNum == 2) * 4 + (int)lVar8);
        pot[lVar8] = pot[lVar8] + (ulong)uVar3;
      }
      uVar7 = uVar7 + 1;
    }
  }
  if ((int)uVar7 < 1) {
    poVar4 = std::operator<<((ostream *)logFile,"   No valid readings!");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    std::operator<<((ostream *)logFile,"   Readings: ");
    bVar6 = true;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      uVar5 = pot[lVar8] / (ulong)uVar7;
      pot[lVar8] = uVar5;
      auVar10._8_4_ = (int)(uVar5 >> 0x20);
      auVar10._0_8_ = uVar5;
      auVar10._12_4_ = 0x45300000;
      dVar9 = (((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 4.5) / 65535.0;
      potV[lVar8] = dVar9;
      poVar4 = std::ostream::_M_insert<double>(dVar9);
      std::operator<<(poVar4," ");
      bVar6 = (bool)(bVar6 & ABS(dVar9 - measured) <= 0.25);
    }
    if (bVar6) {
      poVar4 = std::operator<<((ostream *)logFile,"- PASS");
      std::endl<char,std::char_traits<char>>(poVar4);
      sprintf(buf,"Analog Input - PASS (%4.2lf %4.2lf %4.2lf %4.2lf)",potV[0],potV[1],potV[2],
              potV[3]);
      bVar6 = true;
      goto LAB_00106daf;
    }
    local_c0 = potV[0];
    local_b8 = potV[1];
    local_b0 = potV[2];
    local_108 = potV[3];
  }
  poVar4 = std::operator<<((ostream *)logFile,"- FAIL");
  std::endl<char,std::char_traits<char>>(poVar4);
  sprintf(buf,"Analog Input - FAIL (%4.2lf %4.2lf %4.2lf %4.2lf)",local_c0,local_b8,local_b0,
          local_108);
  bVar6 = false;
LAB_00106daf:
  Amp1394Console::Print(curLine + 2,9,buf);
  return bVar6;
}

Assistant:

bool TestAnalogInputs(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    int i, j;
    char buf[80];
    double measured;
    bool pass = true;

    int potStart = (qlaNum == 2) ? 4 : 0;

    logFile << std::endl << "=== Analog Inputs ===" << std::endl;
    Amp1394Console::Print(curLine++, 9, "This test uses the pot on the test board to set a voltage (+/-0.25V)");
    bool tmp_pass = false;
    while (!tmp_pass) {
        Amp1394Console::Print(curLine, 9, "Enter pot voltage: ");
        Amp1394Console::GetString(buf, sizeof(buf));
        if (sscanf(buf, "%lf", &measured) == 1) tmp_pass = true;
    }
    logFile << "   Input voltage: " << measured << std::endl;
    curLine++;
    // Average 16 readings to reduce noise
    unsigned long pot[4] = { 0, 0, 0, 0};
    double potV[4];
    int numValid = 0;
    for (i = 0; i < 16; i++) {
        if (Port->ReadAllBoards()) {
            numValid++;
            for (j = 0; j < 4; j++)
                pot[j] += Board.GetAnalogInput(potStart+j);
        }
    }
    if (numValid > 0) {
        logFile << "   Readings: ";
        for (j = 0; j < 4; j++) {
            pot[j] /= numValid;
            // Convert to voltage (16-bit converter, Vref = 4.5V)
            potV[j] = pot[j]*4.5/65535;
            logFile << potV[j] << " ";
            if (fabs(potV[j] - measured) > 0.25)
                pass = false;
        }
    }
    else {
        logFile << "   No valid readings!" << std::endl;
        pass = false;
    }
    if (pass) {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "Analog Input - PASS (%4.2lf %4.2lf %4.2lf %4.2lf)",
                potV[0], potV[1], potV[2], potV[3]);
    }
    else {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "Analog Input - FAIL (%4.2lf %4.2lf %4.2lf %4.2lf)",
                potV[0], potV[1], potV[2], potV[3]);
    }

    Amp1394Console::Print(curLine, 9, buf);
    return pass;
}